

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O3

void sha256_compile(sha256_ctx *ctx)

{
  uint uVar1;
  sha2_32t sVar2;
  sha2_32t sVar3;
  sha2_32t sVar4;
  uint uVar5;
  sha2_32t sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  sha2_32t sVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  sha2_32t sVar25;
  uint uVar26;
  uint uVar27;
  sha2_32t sVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  sha2_32t sVar32;
  
  sVar2 = ctx->hash[0];
  sVar3 = ctx->hash[1];
  sVar4 = ctx->hash[2];
  uVar5 = ctx->hash[3];
  sVar6 = ctx->hash[4];
  uVar7 = ctx->hash[5];
  uVar8 = ctx->hash[6];
  uVar9 = ctx->hash[7];
  uVar18 = 0xfffffffffffffff0;
  uVar10 = uVar5;
  sVar19 = sVar6;
  uVar31 = uVar7;
  uVar11 = uVar8;
  sVar25 = sVar2;
  sVar32 = sVar3;
  sVar28 = sVar4;
  uVar13 = uVar9;
  do {
    if (uVar18 == 0xfffffffffffffff0) {
      uVar24 = ctx->wbuf[0];
    }
    else {
      uVar24 = ctx->wbuf[0xe];
      uVar23 = ctx->wbuf[1];
      uVar24 = (uVar24 >> 10 ^ (uVar24 << 0xd | uVar24 >> 0x13) ^ (uVar24 << 0xf | uVar24 >> 0x11))
               + ctx->wbuf[9] + ctx->wbuf[0] +
               (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7));
      ctx->wbuf[0] = uVar24;
    }
    iVar20 = ((uVar31 ^ uVar11) & sVar19 ^ uVar11) + uVar13 +
             ((sVar19 << 7 | sVar19 >> 0x19) ^
             (sVar19 << 0x15 | sVar19 >> 0xb) ^ (sVar19 << 0x1a | sVar19 >> 6)) + uVar24 +
             k256[uVar18 + 0x10];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar13 = ctx->wbuf[1];
    }
    else {
      uVar13 = ctx->wbuf[0xf];
      uVar23 = ctx->wbuf[2];
      uVar13 = (uVar13 >> 10 ^ (uVar13 << 0xd | uVar13 >> 0x13) ^ (uVar13 << 0xf | uVar13 >> 0x11))
               + ctx->wbuf[10] + ctx->wbuf[1] +
               (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7));
      ctx->wbuf[1] = uVar13;
    }
    uVar10 = uVar10 + iVar20;
    iVar29 = ((sVar19 ^ uVar31) & uVar10 ^ uVar31) + uVar11 + uVar13 +
             ((uVar10 * 0x80 | uVar10 >> 0x19) ^
             (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
             k256[uVar18 + 0x11];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar11 = ctx->wbuf[2];
    }
    else {
      uVar11 = ctx->wbuf[3];
      uVar11 = (uVar24 >> 10 ^ (uVar24 << 0xd | uVar24 >> 0x13) ^ (uVar24 << 0xf | uVar24 >> 0x11))
               + ctx->wbuf[0xb] + ctx->wbuf[2] +
               (uVar11 >> 3 ^ (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7));
      ctx->wbuf[2] = uVar11;
    }
    uVar23 = iVar29 + sVar28;
    iVar17 = ((uVar10 ^ sVar19) & uVar23 ^ sVar19) + uVar31 + uVar11 +
             ((uVar23 * 0x80 | uVar23 >> 0x19) ^
             (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
             k256[uVar18 + 0x12];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar31 = ctx->wbuf[3];
    }
    else {
      uVar31 = ctx->wbuf[4];
      uVar31 = (uVar13 >> 10 ^ (uVar13 << 0xd | uVar13 >> 0x13) ^ (uVar13 << 0xf | uVar13 >> 0x11))
               + ctx->wbuf[0xc] + ctx->wbuf[3] +
               (uVar31 >> 3 ^ (uVar31 << 0xe | uVar31 >> 0x12) ^ (uVar31 << 0x19 | uVar31 >> 7));
      ctx->wbuf[3] = uVar31;
    }
    uVar15 = iVar17 + sVar32;
    iVar16 = ((uVar23 ^ uVar10) & uVar15 ^ uVar10) + sVar19 + uVar31 +
             ((uVar15 * 0x80 | uVar15 >> 0x19) ^
             (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
             k256[uVar18 + 0x13];
    if (uVar18 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[4];
    }
    else {
      uVar27 = ctx->wbuf[5];
      sVar19 = (uVar11 >> 10 ^ (uVar11 << 0xd | uVar11 >> 0x13) ^ (uVar11 << 0xf | uVar11 >> 0x11))
               + ctx->wbuf[0xd] + ctx->wbuf[4] +
               (uVar27 >> 3 ^ (uVar27 << 0xe | uVar27 >> 0x12) ^ (uVar27 << 0x19 | uVar27 >> 7));
      ctx->wbuf[4] = sVar19;
    }
    uVar27 = iVar16 + sVar25;
    iVar14 = ((uVar15 ^ uVar23) & uVar27 ^ uVar23) + uVar10 + sVar19 +
             ((uVar27 * 0x80 | uVar27 >> 0x19) ^
             (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) +
             k256[uVar18 + 0x14];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar10 = ctx->wbuf[5];
    }
    else {
      uVar10 = ctx->wbuf[6];
      uVar10 = (uVar31 >> 10 ^ (uVar31 << 0xd | uVar31 >> 0x13) ^ (uVar31 << 0xf | uVar31 >> 0x11))
               + ctx->wbuf[0xe] + ctx->wbuf[5] +
               (uVar10 >> 3 ^ (uVar10 << 0xe | uVar10 >> 0x12) ^ (uVar10 << 0x19 | uVar10 >> 7));
      ctx->wbuf[5] = uVar10;
    }
    uVar26 = (sVar28 & sVar32 ^ (sVar32 ^ sVar28) & sVar25) +
             ((sVar25 << 10 | sVar25 >> 0x16) ^
             (sVar25 << 0x13 | sVar25 >> 0xd) ^ (sVar25 << 0x1e | sVar25 >> 2)) + iVar20;
    uVar12 = iVar14 + uVar26;
    iVar20 = ((uVar27 ^ uVar15) & uVar12 ^ uVar15) + uVar23 + uVar10 +
             ((uVar12 * 0x80 | uVar12 >> 0x19) ^
             (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
             k256[uVar18 + 0x15];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar23 = ctx->wbuf[6];
    }
    else {
      uVar23 = ctx->wbuf[7];
      uVar23 = (sVar19 >> 10 ^ (sVar19 << 0xd | sVar19 >> 0x13) ^ (sVar19 << 0xf | sVar19 >> 0x11))
               + ctx->wbuf[0xf] + ctx->wbuf[6] +
               (uVar23 >> 3 ^ (uVar23 << 0xe | uVar23 >> 0x12) ^ (uVar23 << 0x19 | uVar23 >> 7));
      ctx->wbuf[6] = uVar23;
    }
    uVar30 = ((sVar32 ^ sVar25) & uVar26 ^ sVar25 & sVar32) +
             ((uVar26 * 0x400 | uVar26 >> 0x16) ^
             (uVar26 * 0x80000 | uVar26 >> 0xd) ^ (uVar26 * 0x40000000 | uVar26 >> 2)) + iVar29;
    uVar22 = iVar20 + uVar30;
    iVar29 = ((uVar12 ^ uVar27) & uVar22 ^ uVar27) + uVar15 + uVar23 +
             ((uVar22 * 0x80 | uVar22 >> 0x19) ^
             (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) +
             k256[uVar18 + 0x16];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar15 = ctx->wbuf[7];
    }
    else {
      uVar15 = ctx->wbuf[8];
      uVar15 = (uVar10 >> 10 ^ (uVar10 << 0xd | uVar10 >> 0x13) ^ (uVar10 << 0xf | uVar10 >> 0x11))
               + uVar24 + ctx->wbuf[7] +
               (uVar15 >> 3 ^ (uVar15 << 0xe | uVar15 >> 0x12) ^ (uVar15 << 0x19 | uVar15 >> 7));
      ctx->wbuf[7] = uVar15;
    }
    uVar21 = ((sVar25 ^ uVar26) & uVar30 ^ uVar26 & sVar25) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar17;
    uVar1 = iVar29 + uVar21;
    iVar17 = ((uVar22 ^ uVar12) & uVar1 ^ uVar12) + uVar27 + uVar15 +
             ((uVar1 * 0x80 | uVar1 >> 0x19) ^
             (uVar1 * 0x200000 | uVar1 >> 0xb) ^ (uVar1 * 0x4000000 | uVar1 >> 6)) +
             k256[uVar18 + 0x17];
    if (uVar18 == 0xfffffffffffffff0) {
      sVar25 = ctx->wbuf[8];
    }
    else {
      uVar27 = ctx->wbuf[9];
      sVar25 = (uVar23 >> 10 ^ (uVar23 << 0xd | uVar23 >> 0x13) ^ (uVar23 << 0xf | uVar23 >> 0x11))
               + uVar13 + ctx->wbuf[8] +
               (uVar27 >> 3 ^ (uVar27 << 0xe | uVar27 >> 0x12) ^ (uVar27 << 0x19 | uVar27 >> 7));
      ctx->wbuf[8] = sVar25;
    }
    uVar27 = ((uVar26 ^ uVar30) & uVar21 ^ uVar30 & uVar26) +
             ((uVar21 * 0x400 | uVar21 >> 0x16) ^
             (uVar21 * 0x80000 | uVar21 >> 0xd) ^ (uVar21 * 0x40000000 | uVar21 >> 2)) + iVar16;
    uVar13 = iVar17 + uVar27;
    iVar16 = ((uVar1 ^ uVar22) & uVar13 ^ uVar22) + uVar12 + sVar25 +
             ((uVar13 * 0x80 | uVar13 >> 0x19) ^
             (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
             k256[uVar18 + 0x18];
    if (uVar18 == 0xfffffffffffffff0) {
      sVar32 = ctx->wbuf[9];
    }
    else {
      uVar12 = ctx->wbuf[10];
      sVar32 = (uVar15 >> 10 ^ (uVar15 << 0xd | uVar15 >> 0x13) ^ (uVar15 << 0xf | uVar15 >> 0x11))
               + uVar11 + ctx->wbuf[9] +
               (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7));
      ctx->wbuf[9] = sVar32;
    }
    uVar12 = ((uVar30 ^ uVar21) & uVar27 ^ uVar21 & uVar30) +
             ((uVar27 * 0x400 | uVar27 >> 0x16) ^
             (uVar27 * 0x80000 | uVar27 >> 0xd) ^ (uVar27 * 0x40000000 | uVar27 >> 2)) + iVar14;
    uVar11 = iVar16 + uVar12;
    iVar14 = ((uVar13 ^ uVar1) & uVar11 ^ uVar1) + uVar22 + sVar32 +
             ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
             k256[uVar18 + 0x19];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar31 = ctx->wbuf[10];
    }
    else {
      uVar26 = ctx->wbuf[0xb];
      uVar31 = (sVar25 >> 10 ^ (sVar25 << 0xd | sVar25 >> 0x13) ^ (sVar25 << 0xf | sVar25 >> 0x11))
               + uVar31 + ctx->wbuf[10] +
               (uVar26 >> 3 ^ (uVar26 << 0xe | uVar26 >> 0x12) ^ (uVar26 << 0x19 | uVar26 >> 7));
      ctx->wbuf[10] = uVar31;
    }
    uVar22 = ((uVar21 ^ uVar27) & uVar12 ^ uVar27 & uVar21) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar20;
    uVar26 = uVar22 + iVar14;
    iVar20 = ((uVar11 ^ uVar13) & uVar26 ^ uVar13) + uVar1 + uVar31 +
             ((uVar26 * 0x80 | uVar26 >> 0x19) ^
             (uVar26 * 0x200000 | uVar26 >> 0xb) ^ (uVar26 * 0x4000000 | uVar26 >> 6)) +
             k256[uVar18 + 0x1a];
    if (uVar18 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xb];
    }
    else {
      uVar30 = ctx->wbuf[0xc];
      sVar19 = (sVar32 >> 10 ^ (sVar32 << 0xd | sVar32 >> 0x13) ^ (sVar32 << 0xf | sVar32 >> 0x11))
               + sVar19 + ctx->wbuf[0xb] +
               (uVar30 >> 3 ^ (uVar30 << 0xe | uVar30 >> 0x12) ^ (uVar30 << 0x19 | uVar30 >> 7));
      ctx->wbuf[0xb] = sVar19;
    }
    uVar30 = ((uVar27 ^ uVar12) & uVar22 ^ uVar12 & uVar27) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar29;
    uVar27 = iVar20 + uVar30;
    iVar29 = ((uVar26 ^ uVar11) & uVar27 ^ uVar11) + uVar13 + sVar19 +
             ((uVar27 * 0x80 | uVar27 >> 0x19) ^
             (uVar27 * 0x200000 | uVar27 >> 0xb) ^ (uVar27 * 0x4000000 | uVar27 >> 6)) +
             k256[uVar18 + 0x1b];
    if (uVar18 == 0xfffffffffffffff0) {
      uVar10 = ctx->wbuf[0xc];
    }
    else {
      uVar13 = ctx->wbuf[0xd];
      uVar10 = (uVar31 >> 10 ^ (uVar31 << 0xd | uVar31 >> 0x13) ^ (uVar31 << 0xf | uVar31 >> 0x11))
               + uVar10 + ctx->wbuf[0xc] +
               (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7));
      ctx->wbuf[0xc] = uVar10;
    }
    uVar31 = ((uVar12 ^ uVar22) & uVar30 ^ uVar22 & uVar12) +
             ((uVar30 * 0x400 | uVar30 >> 0x16) ^
             (uVar30 * 0x80000 | uVar30 >> 0xd) ^ (uVar30 * 0x40000000 | uVar30 >> 2)) + iVar17;
    uVar12 = iVar29 + uVar31;
    iVar17 = ((uVar27 ^ uVar26) & uVar12 ^ uVar26) + uVar11 + uVar10 +
             ((uVar12 * 0x80 | uVar12 >> 0x19) ^
             (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
             k256[uVar18 + 0x1c];
    if (uVar18 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xd];
    }
    else {
      uVar13 = ctx->wbuf[0xe];
      sVar19 = (sVar19 >> 10 ^ (sVar19 << 0xd | sVar19 >> 0x13) ^ (sVar19 << 0xf | sVar19 >> 0x11))
               + uVar23 + ctx->wbuf[0xd] +
               (uVar13 >> 3 ^ (uVar13 << 0xe | uVar13 >> 0x12) ^ (uVar13 << 0x19 | uVar13 >> 7));
      ctx->wbuf[0xd] = sVar19;
    }
    uVar23 = ((uVar22 ^ uVar30) & uVar31 ^ uVar30 & uVar22) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar16;
    uVar13 = iVar17 + uVar23;
    iVar16 = ((uVar12 ^ uVar27) & uVar13 ^ uVar27) + uVar26 + sVar19 +
             ((uVar13 * 0x80 | uVar13 >> 0x19) ^
             (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
             k256[uVar18 + 0x1d];
    if (uVar18 == 0xfffffffffffffff0) {
      sVar32 = ctx->wbuf[0xe];
    }
    else {
      uVar11 = ctx->wbuf[0xf];
      sVar32 = (uVar10 >> 10 ^ (uVar10 << 0xd | uVar10 >> 0x13) ^ (uVar10 << 0xf | uVar10 >> 0x11))
               + uVar15 + ctx->wbuf[0xe] +
               (uVar11 >> 3 ^ (uVar11 << 0xe | uVar11 >> 0x12) ^ (uVar11 << 0x19 | uVar11 >> 7));
      ctx->wbuf[0xe] = sVar32;
    }
    uVar10 = ((uVar30 ^ uVar31) & uVar23 ^ uVar31 & uVar30) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar14;
    uVar11 = iVar16 + uVar10;
    iVar14 = ((uVar13 ^ uVar12) & uVar11 ^ uVar12) + uVar27 + sVar32 +
             ((uVar11 * 0x80 | uVar11 >> 0x19) ^
             (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
             k256[uVar18 + 0x1e];
    if (uVar18 == 0xfffffffffffffff0) {
      sVar19 = ctx->wbuf[0xf];
    }
    else {
      sVar19 = (sVar19 >> 10 ^ (sVar19 << 0xd | sVar19 >> 0x13) ^ (sVar19 << 0xf | sVar19 >> 0x11))
               + sVar25 + ctx->wbuf[0xf] +
               (uVar24 >> 3 ^ (uVar24 << 0xe | uVar24 >> 0x12) ^ (uVar24 << 0x19 | uVar24 >> 7));
      ctx->wbuf[0xf] = sVar19;
    }
    uVar31 = ((uVar31 ^ uVar23) & uVar10 ^ uVar23 & uVar31) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar20;
    uVar24 = ((uVar23 ^ uVar10) & uVar31 ^ uVar10 & uVar23) +
             ((uVar31 * 0x400 | uVar31 >> 0x16) ^
             (uVar31 * 0x80000 | uVar31 >> 0xd) ^ (uVar31 * 0x40000000 | uVar31 >> 2)) + iVar29;
    uVar10 = ((uVar10 ^ uVar31) & uVar24 ^ uVar31 & uVar10) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar17;
    sVar28 = ((uVar24 ^ uVar31) & uVar10 ^ uVar24 & uVar31) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar16;
    uVar31 = uVar31 + iVar14;
    sVar32 = ((uVar10 ^ uVar24) & sVar28 ^ uVar10 & uVar24) +
             ((sVar28 * 0x400 | sVar28 >> 0x16) ^
             (sVar28 * 0x80000 | sVar28 >> 0xd) ^ (sVar28 * 0x40000000 | sVar28 >> 2)) + iVar14;
    iVar20 = ((uVar11 ^ uVar13) & uVar31 ^ uVar13) + uVar12 + sVar19 +
             ((uVar31 * 0x80 | uVar31 >> 0x19) ^
             (uVar31 * 0x200000 | uVar31 >> 0xb) ^ (uVar31 * 0x4000000 | uVar31 >> 6)) +
             k256[uVar18 + 0x1f];
    sVar19 = uVar24 + iVar20;
    sVar25 = ((sVar28 ^ uVar10) & sVar32 ^ sVar28 & uVar10) +
             ((sVar32 * 0x400 | sVar32 >> 0x16) ^
             (sVar32 * 0x80000 | sVar32 >> 0xd) ^ (sVar32 * 0x40000000 | sVar32 >> 2)) + iVar20;
    uVar18 = uVar18 + 0x10;
  } while (uVar18 < 0x30);
  ctx->hash[0] = sVar25 + sVar2;
  ctx->hash[1] = sVar32 + sVar3;
  ctx->hash[2] = sVar28 + sVar4;
  ctx->hash[3] = uVar10 + uVar5;
  ctx->hash[4] = sVar19 + sVar6;
  ctx->hash[5] = uVar31 + uVar7;
  ctx->hash[6] = uVar11 + uVar8;
  ctx->hash[7] = uVar13 + uVar9;
  return;
}

Assistant:

void sha256_compile(sha256_ctx ctx[1])
{   sha2_32t    v[8], j;

    memcpy(v, ctx->hash, 8 * sizeof(sha2_32t));

    for(j = 0; j < 64; j += 16)
    {
        h2_cycle( 0, j); h2_cycle( 1, j); h2_cycle( 2, j); h2_cycle( 3, j);
        h2_cycle( 4, j); h2_cycle( 5, j); h2_cycle( 6, j); h2_cycle( 7, j);
        h2_cycle( 8, j); h2_cycle( 9, j); h2_cycle(10, j); h2_cycle(11, j);
        h2_cycle(12, j); h2_cycle(13, j); h2_cycle(14, j); h2_cycle(15, j);
    }

    ctx->hash[0] += v[0]; ctx->hash[1] += v[1]; ctx->hash[2] += v[2]; ctx->hash[3] += v[3];
    ctx->hash[4] += v[4]; ctx->hash[5] += v[5]; ctx->hash[6] += v[6]; ctx->hash[7] += v[7];
}